

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O0

void __thiscall CircBufTest::test6(CircBufTest *this)

{
  CircularBuffer local_358 [8];
  CircularBuffer t2Buf;
  CircularBuffer local_278 [8];
  CircularBuffer t1Buf;
  int local_198 [2];
  uchar local_190 [8];
  anon_struct_129_2_522d0828 buf_t2;
  anon_struct_255_2_a6799241 buf_t1;
  CircBufTest *this_local;
  
  local_198[1] = 0xffffffff;
  buf_t1._247_8_ = this;
  std::fill<unsigned_char*,int>(buf_t2.testBuf + 0x79,buf_t1.testBuf + 0xf6,local_198 + 1);
  local_198[0] = -1;
  std::fill<unsigned_char*,int>(local_190,buf_t2.testBuf + 0x78,local_198);
  buf_t1.testBuf[0xf6] = 0xff;
  buf_t2.testBuf[0x78] = 0xff;
  JetHead::CircularBuffer::CircularBuffer(local_278,buf_t2.testBuf + 0x79,0xfe);
  JetHead::CircularBuffer::CircularBuffer(local_358,local_190,0x80);
  test1(this,local_278);
  if (buf_t1.testBuf[0xf6] != 0xff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x388,"Wrapped circular buffer has one past the end problem");
  }
  test2(this,local_358);
  if (buf_t2.testBuf[0x78] != 0xff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x38f,"Wrapped circular buffer has one past the end problem");
  }
  JetHead::CircularBuffer::~CircularBuffer(local_358);
  JetHead::CircularBuffer::~CircularBuffer(local_278);
  return;
}

Assistant:

void CircBufTest::test6()
{

	// Use a struct so that you can set a watchpoint in gdb on overflow
	// to see when circbuf attempts to use a byte of memeory it wasn't
	// given.
	struct {
		uint8_t testBuf[HUGE_BUF_SIZE];
		uint8_t overflow;
	} buf_t1;
	
	struct {
		uint8_t testBuf[BUFFER_SIZE];
		uint8_t overflow;
	} buf_t2 ;

	fill(buf_t1.testBuf, buf_t1.testBuf + HUGE_BUF_SIZE, -1);
	fill(buf_t2.testBuf, buf_t2.testBuf + BUFFER_SIZE, -1);
	
	buf_t1.overflow = (uint8_t)-1;
	buf_t2.overflow = (uint8_t)-1;
	
	CircularBuffer t1Buf(buf_t1.testBuf, HUGE_BUF_SIZE);
	CircularBuffer t2Buf(buf_t2.testBuf, BUFFER_SIZE);
	
	// Try test 1 again and check overflow
	test1(&t1Buf);
	if (buf_t1.overflow != (uint8_t)-1)
	{
		TestFailed("Wrapped circular buffer has one past the end problem");
	}
	
	test2(&t2Buf);

	if( buf_t2.overflow != (uint8_t)-1)
	{
		TestFailed("Wrapped circular buffer has one past the end problem");
	}
}